

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

parser_value * parser_getval(parser *p,char *name)

{
  int iVar1;
  parser_value *ppVar2;
  
  ppVar2 = (parser_value *)&p->fhead;
  do {
    ppVar2 = (parser_value *)(ppVar2->spec).next;
    if (ppVar2 == (parser_value *)0x0) {
      quit_fmt("parser_getval error: name is %s\n",name);
      return (parser_value *)0x0;
    }
    iVar1 = strcmp((ppVar2->spec).name,name);
  } while (iVar1 != 0);
  return ppVar2;
}

Assistant:

static struct parser_value *parser_getval(struct parser *p, const char *name) {
	struct parser_value *v;
	for (v = p->fhead; v; v = (struct parser_value *)v->spec.next) {
		if (streq(v->spec.name, name)) {
			return v;
		}
	}
	quit_fmt("parser_getval error: name is %s\n", name);
	return 0; /* Needed to avoid Windows compiler warning */
}